

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<long,_double>::InnerMap::TreeConvert(InnerMap *this,size_type b)

{
  void **ppvVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  _Rb_tree_impl<google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_true> *this_00;
  size_type sVar4;
  size_type sVar5;
  void *pvVar6;
  LogFinisher local_69;
  other tree_allocator;
  _Node_allocator local_60;
  undefined1 local_50 [40];
  
  ppvVar1 = this->table_;
  pvVar2 = ppvVar1[b];
  if (pvVar2 == (void *)0x0) {
    pvVar6 = ppvVar1[b ^ 1];
LAB_004d0b2a:
    if (pvVar6 != pvVar2 || pvVar6 == (void *)0x0) goto LAB_004d0b7c;
  }
  else {
    pvVar6 = ppvVar1[b ^ 1];
    if (pvVar2 != pvVar6) goto LAB_004d0b2a;
  }
  internal::LogMessage::LogMessage
            ((LogMessage *)&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
             ,0x334);
  pLVar3 = internal::LogMessage::operator<<
                     ((LogMessage *)&local_60,
                      "CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): ");
  internal::LogFinisher::operator=((LogFinisher *)&tree_allocator,pLVar3);
  internal::LogMessage::~LogMessage((LogMessage *)&local_60);
LAB_004d0b7c:
  tree_allocator.arena_ = (this->alloc_).arena_;
  this_00 = (_Rb_tree_impl<google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_true> *)
            MapAllocator<std::set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>_>
            ::allocate(&tree_allocator,1,(void *)0x0);
  local_60.arena_ = (this->alloc_).arena_;
  local_50._16_8_ = local_50;
  local_50._0_4_ = _S_red;
  local_50._8_8_ = (pointer)0x0;
  local_50._32_8_ = 0;
  local_50._24_8_ = local_50._16_8_;
  std::
  _Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  ::_Rb_tree_impl<google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_true>::_Rb_tree_impl
            (this_00,(_Rb_tree_impl<google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_true>
                      *)&local_60);
  std::
  _Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  ::~_Rb_tree((_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
               *)&local_60);
  sVar4 = CopyListToTree(this,b,(Tree *)this_00);
  sVar5 = CopyListToTree(this,b ^ 1,(Tree *)this_00);
  if (sVar5 + sVar4 != (this_00->super__Rb_tree_header)._M_node_count) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x33f);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_60,"CHECK failed: (count) == (tree->size()): ");
    internal::LogFinisher::operator=(&local_69,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)&local_60);
  }
  this->table_[b ^ 1] = this_00;
  this->table_[b] = this_00;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      typename Allocator::template rebind<Tree>::other tree_allocator(alloc_);
      Tree* tree = tree_allocator.allocate(1);
      // We want to use the three-arg form of construct, if it exists, but we
      // create a temporary and use the two-arg construct that's known to exist.
      // It's clunky, but the compiler should be able to generate more-or-less
      // the same code.
      tree_allocator.construct(tree,
                               Tree(KeyCompare(), KeyPtrAllocator(alloc_)));
      // Now the tree is ready to use.
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }